

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double * circular_normal_sample(double *a,double b,int *seed)

{
  double dVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  pdVar2 = (double *)operator_new__(0x10);
  dVar3 = r8_uniform_01(seed);
  dVar4 = r8_uniform_01(seed);
  dVar3 = log(dVar3);
  dVar3 = dVar3 * -2.0;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar1 = *a;
  dVar5 = cos(dVar4 * 6.283185307179586);
  *pdVar2 = dVar5 * dVar3 * b + dVar1;
  dVar1 = a[1];
  dVar4 = sin(dVar4 * 6.283185307179586);
  pdVar2[1] = dVar4 * dVar3 * b + dVar1;
  return pdVar2;
}

Assistant:

double *circular_normal_sample ( double a[2], double b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    CIRCULAR_NORMAL_SAMPLE samples the Circular Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    03 January 2011
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A[2], a parameter of the PDF, the mean value.
//
//    Input, double B, a parameter of the PDF, the standard deviation.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double CIRCULAR_NORMAL_SAMPLE[2], a sample of the PDF.
//
{
  const double r8_pi = 3.14159265358979323;
  double r;
  double v1;
  double v2;
  double *x;

  x = new double[2];

  v1 = r8_uniform_01 ( seed );
  v2 = r8_uniform_01 ( seed );

  r = sqrt ( - 2.0 * log ( v1 ) );

  x[0] = a[0] + b * r * cos ( 2.0 * r8_pi * v2 );
  x[1] = a[1] + b * r * sin ( 2.0 * r8_pi * v2 );

  return x;
}